

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

CURLcode send_telnet_data(Curl_easy *data,char *buffer,ssize_t nread)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  dynbuf *s;
  uchar *local_58;
  size_t bytes_written;
  pollfd pfd [1];
  
  pcVar1 = data->conn;
  pvVar4 = memchr(buffer,0xff,nread);
  if (pvVar4 == (void *)0x0) {
    CVar2 = CURLE_OK;
    local_58 = (uchar *)buffer;
  }
  else {
    s = &((data->req).p.telnet)->out;
    Curl_dyn_reset(s);
    CVar2 = CURLE_OK;
    uVar5 = 0;
    while ((uVar5 < (ulong)nread && (CVar2 == CURLE_OK))) {
      CVar2 = Curl_dyn_addn(s,buffer + uVar5,1);
      if ((CVar2 == CURLE_OK) && (CVar2 = CURLE_OK, buffer[uVar5] == -1)) {
        CVar2 = Curl_dyn_addn(s,anon_var_dwarf_156f3b,1);
      }
      uVar5 = uVar5 + 1;
    }
    nread = Curl_dyn_len(s);
    local_58 = Curl_dyn_uptr(s);
  }
  uVar5 = 0;
  while ((CVar2 == CURLE_OK && (uVar5 <= (ulong)nread && nread - uVar5 != 0))) {
    pfd[0].fd = pcVar1->sock[0];
    pfd[0].events = 4;
    iVar3 = Curl_poll(pfd,1,-1);
    if (iVar3 + 1U < 2) {
      CVar2 = CURLE_SEND_ERROR;
    }
    else {
      bytes_written = 0;
      CVar2 = Curl_xfer_send(data,local_58 + uVar5,nread - uVar5,false,&bytes_written);
      uVar5 = uVar5 + bytes_written;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode send_telnet_data(struct Curl_easy *data,
                                 char *buffer, ssize_t nread)
{
  size_t i, outlen;
  unsigned char *outbuf;
  CURLcode result = CURLE_OK;
  size_t bytes_written;
  size_t total_written = 0;
  struct connectdata *conn = data->conn;
  struct TELNET *tn = data->req.p.telnet;

  DEBUGASSERT(tn);
  DEBUGASSERT(nread > 0);
  if(nread < 0)
    return CURLE_TOO_LARGE;

  if(memchr(buffer, CURL_IAC, nread)) {
    /* only use the escape buffer when necessary */
    Curl_dyn_reset(&tn->out);

    for(i = 0; i < (size_t)nread && !result; i++) {
      result = Curl_dyn_addn(&tn->out, &buffer[i], 1);
      if(!result && ((unsigned char)buffer[i] == CURL_IAC))
        /* IAC is FF in hex */
        result = Curl_dyn_addn(&tn->out, "\xff", 1);
    }

    outlen = Curl_dyn_len(&tn->out);
    outbuf = Curl_dyn_uptr(&tn->out);
  }
  else {
    outlen = (size_t)nread;
    outbuf = (unsigned char *)buffer;
  }
  while(!result && total_written < outlen) {
    /* Make sure socket is writable to avoid EWOULDBLOCK condition */
    struct pollfd pfd[1];
    pfd[0].fd = conn->sock[FIRSTSOCKET];
    pfd[0].events = POLLOUT;
    switch(Curl_poll(pfd, 1, -1)) {
      case -1:                    /* error, abort writing */
      case 0:                     /* timeout (will never happen) */
        result = CURLE_SEND_ERROR;
        break;
      default:                    /* write! */
        bytes_written = 0;
        result = Curl_xfer_send(data, outbuf + total_written,
                                outlen - total_written, FALSE, &bytes_written);
        total_written += bytes_written;
        break;
    }
  }

  return result;
}